

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  long lVar1;
  long lVar2;
  Message *pMVar3;
  Arena *in_RCX;
  long *in_RDX;
  long *in_RSI;
  MessageFactory *unaff_retaddr;
  FieldDescriptor *in_stack_00000008;
  Message *sub_message_copy;
  Message *in_stack_ffffffffffffffd8;
  
  if (in_RDX != (long *)0x0) {
    lVar1 = (**(code **)(*in_RDX + 0x28))();
    lVar2 = (**(code **)(*in_RSI + 0x28))();
    if (lVar1 != lVar2) {
      lVar1 = (**(code **)(*in_RDX + 0x28))();
      if ((lVar1 == 0) && (lVar1 = (**(code **)(*in_RSI + 0x28))(), lVar1 != 0)) {
        (**(code **)(*in_RSI + 0x28))();
        Arena::Own<google::protobuf::Message>(in_RCX,in_stack_ffffffffffffffd8);
        UnsafeArenaSetAllocatedMessage
                  ((Reflection *)sub_message,(Message *)field,sub_message_copy,in_stack_00000008);
        return;
      }
      pMVar3 = MutableMessage((Reflection *)field,sub_message_copy,in_stack_00000008,unaff_retaddr);
      (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x10])(pMVar3,in_RDX);
      return;
    }
  }
  UnsafeArenaSetAllocatedMessage
            ((Reflection *)sub_message,(Message *)field,sub_message_copy,in_stack_00000008);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != nullptr &&
      sub_message->GetArena() != message->GetArena()) {
    if (sub_message->GetArena() == nullptr && message->GetArena() != nullptr) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArena()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}